

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ModportSubroutinePortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSubroutinePortSyntax,slang::syntax::FunctionPrototypeSyntax&>
          (BumpAllocator *this,FunctionPrototypeSyntax *args)

{
  ModportSubroutinePortSyntax *pMVar1;
  
  pMVar1 = (ModportSubroutinePortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportSubroutinePortSyntax *)this->endPtr < pMVar1 + 1) {
    pMVar1 = (ModportSubroutinePortSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pMVar1 + 1);
  }
  (pMVar1->super_ModportPortSyntax).super_SyntaxNode.kind = ModportSubroutinePort;
  (pMVar1->super_ModportPortSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pMVar1->super_ModportPortSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pMVar1->prototype).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pMVar1;
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }